

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O0

size_t __thiscall pstore::exchange::export_ns::ostream_base::flush(ostream_base *this)

{
  size_t sVar1;
  char *pcVar2;
  size_type sVar3;
  ostream_base *this_local;
  
  sVar1 = buffered_chars(this);
  (*this->_vptr_ostream_base[2])(this,&this->buffer_,sVar1);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->buffer_);
  this->ptr_ = pcVar2;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
  return sVar3;
}

Assistant:

std::size_t ostream_base::flush () {
                this->flush_buffer (buffer_, this->buffered_chars ());
                ptr_ = buffer_.data ();
                return buffer_.size ();
            }